

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O2

ssize_t __thiscall Pl_Function::write(Pl_Function *this,int __fd,void *__buf,size_t __n)

{
  Pipeline *pPVar1;
  int iVar2;
  ssize_t extraout_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::operator()
            (&((this->m)._M_t.
               super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
               .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl)->fn,
             (uchar *)CONCAT44(in_register_00000034,__fd),(unsigned_long)__buf);
  pPVar1 = (this->super_Pipeline).next_;
  if (pPVar1 != (Pipeline *)0x0) {
    iVar2 = (*pPVar1->_vptr_Pipeline[2])(pPVar1,(uchar *)CONCAT44(in_register_00000034,__fd),__buf);
    return CONCAT44(extraout_var,iVar2);
  }
  return extraout_RAX;
}

Assistant:

void
Pl_Function::write(unsigned char const* buf, size_t len)
{
    m->fn(buf, len);
    if (next()) {
        next()->write(buf, len);
    }
}